

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.c
# Opt level: O2

int split(char *string,char **fields,int nfields,char *sep)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char cVar6;
  char cVar7;
  char *pcVar8;
  char *pcVar9;
  
  cVar1 = *sep;
  if (cVar1 == '\0') {
    for (; (cVar2 = *string, cVar2 == ' ' || (cVar2 == '\t')); string = string + 1) {
    }
    cVar7 = ' ';
    sep = " \t";
  }
  else {
    cVar2 = *string;
    cVar7 = cVar1;
  }
  if (cVar2 == '\0') {
    nfields = 0;
  }
  else {
    cVar2 = sep[1];
    iVar3 = nfields;
    if (cVar2 != '\0') {
      iVar4 = nfields;
      if (sep[2] != '\0') {
        iVar3 = 0;
        do {
          if (iVar3 < nfields) {
            *fields = string;
            fields = fields + 1;
          }
          iVar3 = iVar3 + 1;
          do {
            pcVar8 = string;
            if (*pcVar8 == '\0') {
              return iVar3;
            }
            string = pcVar8 + 1;
            pcVar9 = sep;
            do {
              cVar1 = *pcVar9;
              if (cVar1 == '\0') break;
              pcVar9 = pcVar9 + 1;
            } while (cVar1 != *pcVar8);
          } while (cVar1 == '\0');
          pcVar9 = string;
          if (iVar3 < nfields) {
            *pcVar8 = '\0';
          }
          do {
            string = pcVar9;
            pcVar8 = sep;
            do {
              cVar1 = *pcVar8;
              if (cVar1 == '\0') break;
              pcVar8 = pcVar8 + 1;
            } while (cVar1 != *string);
            pcVar9 = string + 1;
          } while (cVar1 != '\0');
        } while( true );
      }
      while( true ) {
        *fields = string;
        fields = fields + 1;
        iVar3 = iVar4 + -1;
        pcVar9 = string;
        pcVar8 = string;
        while( true ) {
          pcVar5 = pcVar8 + 1;
          cVar6 = *pcVar8;
          if ((cVar6 == cVar2) || (cVar7 == cVar6)) break;
          pcVar9 = pcVar9 + 1;
          pcVar8 = pcVar5;
          if (cVar6 == '\0') {
            if ((cVar1 == '\0') && (*string == '\0')) {
              iVar3 = iVar4;
            }
            goto LAB_001049a2;
          }
        }
        iVar4 = nfields;
        if (iVar3 == 0) break;
        *pcVar8 = '\0';
        do {
          pcVar8 = pcVar9 + 1;
          pcVar9 = pcVar9 + 1;
          string = pcVar9;
          iVar4 = iVar3;
        } while (*pcVar8 == cVar2 || cVar7 == *pcVar8);
      }
      do {
        if (cVar6 == '\0') {
          if (cVar1 != '\0') {
            return iVar4;
          }
          do {
            pcVar8 = pcVar5 + -2;
            pcVar5 = pcVar5 + -1;
          } while (*pcVar8 == cVar2 || cVar7 == *pcVar8);
          if (*pcVar5 == '\0') {
            return iVar4;
          }
          if (iVar4 == nfields + 1) {
            *pcVar5 = '\0';
          }
          return iVar4 + -1;
        }
        pcVar5 = pcVar5 + -1;
        do {
          pcVar8 = pcVar5 + 1;
          pcVar5 = pcVar5 + 1;
        } while (*pcVar8 == cVar2 || cVar7 == *pcVar8);
        do {
          cVar6 = *pcVar5;
          pcVar5 = pcVar5 + 1;
          if ((cVar6 == cVar2) || (cVar6 == '\0')) break;
        } while (cVar7 != cVar6);
        iVar4 = iVar4 + 1;
      } while( true );
    }
    while( true ) {
      *fields = string;
      iVar3 = iVar3 + -1;
      if (iVar3 == 0) break;
      fields = fields + 1;
      pcVar8 = string;
      while( true ) {
        string = pcVar8 + 1;
        cVar1 = *pcVar8;
        if (cVar7 == cVar1) break;
        pcVar8 = string;
        if (cVar1 == '\0') {
LAB_001049a2:
          return nfields - iVar3;
        }
      }
      *pcVar8 = '\0';
    }
    do {
      while( true ) {
        cVar1 = *string;
        if (cVar7 != cVar1) break;
        nfields = nfields + 1;
        string = string + 1;
      }
      string = string + 1;
    } while (cVar1 != '\0');
  }
  return nfields;
}

Assistant:

int				/* number of fields, including overflow */
split(string, fields, nfields, sep)
char *string;
char *fields[];			/* list is not NULL-terminated */
int nfields;			/* number of entries available in fields[] */
char *sep;			/* "" white, "c" single char, "ab" [ab]+ */
{
	register char *p = string;
	register char c;			/* latest character */
	register char sepc = sep[0];
	register char sepc2;
	register int fn;
	register char **fp = fields;
	register char *sepp;
	register int trimtrail;

	/* white space */
	if (sepc == '\0') {
		while ((c = *p++) == ' ' || c == '\t')
			continue;
		p--;
		trimtrail = 1;
		sep = " \t";	/* note, code below knows this is 2 long */
		sepc = ' ';
	} else
		trimtrail = 0;
	sepc2 = sep[1];		/* now we can safely pick this up */

	/* catch empties */
	if (*p == '\0')
		return(0);

	/* single separator */
	if (sepc2 == '\0') {
		fn = nfields;
		for (;;) {
			*fp++ = p;
			fn--;
			if (fn == 0)
				break;
			while ((c = *p++) != sepc)
				if (c == '\0')
					return(nfields - fn);
			*(p-1) = '\0';
		}
		/* we have overflowed the fields vector -- just count them */
		fn = nfields;
		for (;;) {
			while ((c = *p++) != sepc)
				if (c == '\0')
					return(fn);
			fn++;
		}
		/* not reached */
	}

	/* two separators */
	if (sep[2] == '\0') {
		fn = nfields;
		for (;;) {
			*fp++ = p;
			fn--;
			while ((c = *p++) != sepc && c != sepc2)
				if (c == '\0') {
					if (trimtrail && **(fp-1) == '\0')
						fn++;
					return(nfields - fn);
				}
			if (fn == 0)
				break;
			*(p-1) = '\0';
			while ((c = *p++) == sepc || c == sepc2)
				continue;
			p--;
		}
		/* we have overflowed the fields vector -- just count them */
		fn = nfields;
		while (c != '\0') {
			while ((c = *p++) == sepc || c == sepc2)
				continue;
			p--;
			fn++;
			while ((c = *p++) != '\0' && c != sepc && c != sepc2)
				continue;
		}
		/* might have to trim trailing white space */
		if (trimtrail) {
			p--;
			while ((c = *--p) == sepc || c == sepc2)
				continue;
			p++;
			if (*p != '\0') {
				if (fn == nfields+1)
					*p = '\0';
				fn--;
			}
		}
		return(fn);
	}

	/* n separators */
	fn = 0;
	for (;;) {
		if (fn < nfields)
			*fp++ = p;
		fn++;
		for (;;) {
			c = *p++;
			if (c == '\0')
				return(fn);
			sepp = sep;
			while ((sepc = *sepp++) != '\0' && sepc != c)
				continue;
			if (sepc != '\0')	/* it was a separator */
				break;
		}
		if (fn < nfields)
			*(p-1) = '\0';
		for (;;) {
			c = *p++;
			sepp = sep;
			while ((sepc = *sepp++) != '\0' && sepc != c)
				continue;
			if (sepc == '\0')	/* it wasn't a separator */
				break;
		}
		p--;
	}

	/* not reached */
}